

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void tinygltf::SerializeGltfBuffer(Buffer *buffer,json *o)

{
  size_type number;
  long lVar1;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  json *local_18;
  json *o_local;
  Buffer *buffer_local;
  
  local_18 = o;
  o_local = (json *)buffer;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"byteLength",&local_39);
  number = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(o_local + 2));
  SerializeNumberProperty<unsigned_long>((string *)local_38,number,local_18);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  SerializeGltfBufferData
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(o_local + 2),local_18);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"name",&local_71);
    SerializeStringProperty((string *)local_70,(string *)o_local,local_18);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  SerializeExtrasAndExtensions<tinygltf::Buffer>((Buffer *)o_local,local_18);
  return;
}

Assistant:

static void SerializeGltfBuffer(const Buffer &buffer, detail::json &o) {
  SerializeNumberProperty("byteLength", buffer.data.size(), o);
  SerializeGltfBufferData(buffer.data, o);

  if (buffer.name.size()) SerializeStringProperty("name", buffer.name, o);

  SerializeExtrasAndExtensions(buffer, o);
}